

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pulseaudio.cpp
# Opt level: O3

void anon_unknown.dwarf_28bf56::PulsePlayback::sinkNameCallbackC
               (pa_context *context,pa_sink_info *info,int eol,void *pdata)

{
  char *__s;
  long lVar1;
  char *pcVar2;
  
  if (eol != 0) {
    std::condition_variable::notify_all();
    return;
  }
  __s = info->description;
  lVar1 = *(long *)((long)pdata + 8);
  pcVar2 = *(char **)(lVar1 + 0x30);
  strlen(__s);
  std::__cxx11::string::_M_replace(lVar1 + 0x28,0,pcVar2,(ulong)__s);
  return;
}

Assistant:

void PulsePlayback::sinkNameCallback(pa_context*, const pa_sink_info *info, int eol) noexcept
{
    if(eol)
    {
        mMainloop.getCondVar().notify_all();
        return;
    }
    mDevice->DeviceName = info->description;
}